

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

int Sfm_MffcRef_rec(Abc_Obj_t *pObj,Vec_Int_t *vMffc)

{
  int iVar1;
  uint Entry;
  Abc_Obj_t *pObj_00;
  double dVar2;
  int local_28;
  int local_24;
  int Area;
  int i;
  Abc_Obj_t *pFanin;
  Vec_Int_t *vMffc_local;
  Abc_Obj_t *pObj_local;
  
  dVar2 = Mio_GateReadArea((Mio_Gate_t *)(pObj->field_5).pData);
  local_28 = Scl_Flt2Int((float)dVar2);
  for (local_24 = 0; iVar1 = Abc_ObjFaninNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj_00 = Abc_ObjFanin(pObj,local_24);
    iVar1 = (pObj_00->vFanouts).nSize;
    (pObj_00->vFanouts).nSize = iVar1 + 1;
    if ((iVar1 == 0) && (iVar1 = Abc_ObjIsCi(pObj_00), iVar1 == 0)) {
      iVar1 = Sfm_MffcRef_rec(pObj_00,vMffc);
      local_28 = iVar1 + local_28;
    }
  }
  if (vMffc != (Vec_Int_t *)0x0) {
    Entry = Abc_ObjId(pObj);
    Vec_IntPush(vMffc,Entry);
  }
  return local_28;
}

Assistant:

int Sfm_MffcRef_rec( Abc_Obj_t * pObj, Vec_Int_t * vMffc )
{
    Abc_Obj_t * pFanin;
    int i, Area = Scl_Flt2Int(Mio_GateReadArea((Mio_Gate_t *)pObj->pData));
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        if ( pFanin->vFanouts.nSize++ == 0 && !Abc_ObjIsCi(pFanin) )
            Area += Sfm_MffcRef_rec( pFanin, vMffc );
    }
    if ( vMffc )
        Vec_IntPush( vMffc, Abc_ObjId(pObj) );
    return Area;
}